

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_38da3::ParseDummyNode::configureAttribute
          (ParseDummyNode *this,ConfigureContext *param_1,StringRef name,
          ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> values)

{
  undefined1 *puVar1;
  int iVar2;
  char *pcVar3;
  pair<llvm::StringRef,_llvm::StringRef> *ppVar4;
  pair<llvm::StringRef,_llvm::StringRef> *ppVar5;
  iterator __begin3;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  ppVar5 = values.Data;
  pcVar3 = name.Data;
  iVar2 = (*(this->delegate->super_BuildFileDelegate)._vptr_BuildFileDelegate[0xd])();
  if ((char)iVar2 != '\0') {
    local_70 = &local_60;
    if (pcVar3 == (char *)0x0) {
      local_68 = 0;
      local_60 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,pcVar3,pcVar3 + name.Length);
    }
    printf("  -- \'%s\': {\n",local_70);
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    if (values.Length != 0) {
      ppVar4 = ppVar5 + values.Length;
      do {
        pcVar3 = (ppVar5->first).Data;
        local_70 = &local_60;
        if (pcVar3 == (char *)0x0) {
          local_68 = 0;
          local_60 = 0;
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,pcVar3,pcVar3 + (ppVar5->first).Length);
        }
        puVar1 = local_70;
        pcVar3 = (ppVar5->second).Data;
        local_50 = &local_40;
        if (pcVar3 == (char *)0x0) {
          local_48 = 0;
          local_40 = 0;
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,pcVar3,pcVar3 + (ppVar5->second).Length);
        }
        printf("  --   \'%s\': \'%s\'\n",puVar1,local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
        }
        ppVar5 = ppVar5 + 1;
      } while (ppVar5 != ppVar4);
    }
    puts("  -- }");
  }
  return true;
}

Assistant:

virtual bool configureAttribute(
      const ConfigureContext&, StringRef name,
      ArrayRef<std::pair<StringRef, StringRef>> values) override {
    if (delegate.shouldShowOutput()) {
      printf("  -- '%s': {\n", name.str().c_str());
      for (const auto& value: values) {
        printf("  --   '%s': '%s'\n", value.first.str().c_str(),
               value.second.str().c_str());
      }
      printf("  -- }\n");
    }
    return true;
  }